

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::IsQLAExpanded(AmpIO *this,uint index)

{
  uint32_t uVar1;
  undefined1 local_15;
  bool ret;
  uint index_local;
  AmpIO *this_local;
  
  local_15 = false;
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x514c4131) {
    uVar1 = GetStatus(this);
    local_15 = (uVar1 & 0x1000) != 0;
  }
  else {
    uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar1 == 0x44514c41) {
      uVar1 = GetStatus(this);
      local_15 = (uVar1 & index & 3) != 0;
    }
  }
  return local_15;
}

Assistant:

bool AmpIO::IsQLAExpanded(unsigned int index) const
{
    bool ret = false;
    if (GetHardwareVersion() == QLA1_String)
        ret = GetStatus() & 0x00001000;
    else if (GetHardwareVersion() == DQLA_String)
        ret = GetStatus() & (index&0x0003);
    return ret;
}